

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int ark_MRIStepInnerReset(MRIStepInnerStepper stepper,sunrealtype tR,N_Vector yR)

{
  int iVar1;
  sunrealtype in_RSI;
  void *in_XMM0_Qa;
  int retval;
  void *arkode_mem;
  MRIStepInnerStepper in_stack_ffffffffffffffc8;
  N_Vector in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  iVar1 = MRIStepInnerStepper_GetContent(in_stack_ffffffffffffffc8,(void **)0x1a3573);
  if (iVar1 == 0) {
    iVar1 = ARKodeReset(in_XMM0_Qa,in_RSI,in_stack_ffffffffffffffd8);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int ark_MRIStepInnerReset(MRIStepInnerStepper stepper, sunrealtype tR, N_Vector yR)
{
  void* arkode_mem;
  int retval = MRIStepInnerStepper_GetContent(stepper, &arkode_mem);
  if (retval != ARK_SUCCESS) { return -1; }
  retval = ARKodeReset(arkode_mem, tR, yR);
  if (retval == ARK_SUCCESS) { return 0; }
  return -1;
}